

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O3

void sys_vgui(char *fmt,...)

{
  _instanceinter *p_Var1;
  char in_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  ssize_t sVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *pcVar7;
  size_t __n;
  undefined8 in_RSI;
  char *__format;
  int iVar8;
  ulong uVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  p_Var1 = pd_maininstance.pd_inter;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((pd_maininstance.pd_inter)->i_havegui != 0) {
    local_e0 = in_RSI;
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    if ((pd_maininstance.pd_inter)->i_guibuf == (char *)0x0) {
      uVar3 = 0x2000;
      pcVar5 = (char *)malloc(0x2000);
      p_Var1->i_guibuf = pcVar5;
      if (pcVar5 == (char *)0x0) {
        sys_vgui_cold_2();
        if ((-1 < (int)uVar3) &&
           (pcVar5 = (char *)realloc((pd_maininstance.pd_inter)->i_guibuf,(ulong)uVar3),
           p_Var1 = pd_maininstance.pd_inter, pcVar5 != (char *)0x0)) {
          (pd_maininstance.pd_inter)->i_guisize = uVar3;
          p_Var1->i_guibuf = pcVar5;
          return;
        }
        __n = (long)(pd_maininstance.pd_inter)->i_guihead -
              (long)(pd_maininstance.pd_inter)->i_guitail;
        uVar3 = 0;
        do {
          uVar9 = (ulong)(uint)(pd_maininstance.pd_inter)->i_guisock;
          sVar6 = send((pd_maininstance.pd_inter)->i_guisock,
                       (pd_maininstance.pd_inter)->i_guibuf +
                       (ulong)uVar3 + (long)(pd_maininstance.pd_inter)->i_guitail,__n,0);
          if ((int)sVar6 < 0) {
            sys_trytogetmoreguibuf_cold_1();
            sys_vgui("%s",uVar9);
            return;
          }
          uVar3 = uVar3 + (int)sVar6;
        } while ((int)uVar3 < (int)__n);
        p_Var1 = pd_maininstance.pd_inter;
        p_Var1->i_guihead = 0;
        p_Var1->i_guitail = 0;
        return;
      }
      p_Var1->i_guisize = 0x2000;
      p_Var1->i_guihead = 0;
      p_Var1->i_guitail = 0;
      iVar2 = 0;
      iVar8 = 0x2000;
    }
    else {
      iVar2 = (pd_maininstance.pd_inter)->i_guihead;
      iVar8 = (pd_maininstance.pd_inter)->i_guisize;
    }
    if (iVar8 + -0x1000 < iVar2) {
      sys_trytogetmoreguibuf(iVar8 + 0x2000);
    }
    local_108 = 0x3000000008;
    local_100 = &ap[0].overflow_arg_area;
    local_f8 = local_e8;
    uVar3 = vsnprintf((pd_maininstance.pd_inter)->i_guibuf + (pd_maininstance.pd_inter)->i_guihead,
                      (long)(pd_maininstance.pd_inter)->i_guisize -
                      (long)(pd_maininstance.pd_inter)->i_guihead,fmt,&local_108);
    if ((int)uVar3 < 0) {
      sys_vgui_cold_1();
    }
    else {
      iVar2 = (pd_maininstance.pd_inter)->i_guihead;
      if ((pd_maininstance.pd_inter)->i_guisize - iVar2 <= (int)uVar3) {
        uVar4 = 0x2000;
        if (0x2000 < uVar3) {
          uVar4 = uVar3;
        }
        sys_trytogetmoreguibuf(uVar4 + (pd_maininstance.pd_inter)->i_guisize + 1);
        local_108 = 0x3000000008;
        local_100 = &ap[0].overflow_arg_area;
        local_f8 = local_e8;
        uVar4 = vsnprintf((pd_maininstance.pd_inter)->i_guibuf +
                          (pd_maininstance.pd_inter)->i_guihead,
                          (long)(pd_maininstance.pd_inter)->i_guisize -
                          (long)(pd_maininstance.pd_inter)->i_guihead,fmt,&local_108);
        if (uVar4 != uVar3) {
          bug("sys_vgui");
        }
        iVar2 = (pd_maininstance.pd_inter)->i_guihead;
        uVar4 = (pd_maininstance.pd_inter)->i_guisize - iVar2;
        if ((int)uVar4 <= (int)uVar3) {
          uVar3 = uVar4;
        }
      }
      if ((sys_debuglevel & 1U) != 0) {
        pcVar5 = (pd_maininstance.pd_inter)->i_guibuf;
        pcVar7 = ">> ";
        if (sys_vgui::newmess == 0) {
          pcVar7 = "";
        }
        __format = "\x1b[0;1;35m%s%s\x1b[0m";
        if (stderr_isatty == 0) {
          __format = "%s%s";
        }
        if ((sys_debuglevel & 4U) == 0) {
          __format = "%s%s";
        }
        fprintf(_stderr,__format,pcVar7,pcVar5 + iVar2);
        sys_vgui::newmess = (int)((pcVar5 + iVar2)[(long)(int)uVar3 + -1] == '\n');
      }
      p_Var1 = pd_maininstance.pd_inter;
      (pd_maininstance.pd_inter)->i_guihead = (pd_maininstance.pd_inter)->i_guihead + uVar3;
      p_Var1->i_bytessincelastping = p_Var1->i_bytessincelastping + uVar3;
    }
  }
  return;
}

Assistant:

void sys_vgui(const char *fmt, ...)
{
    int msglen, bytesleft, headwas, nwrote;
    va_list ap;

    if (!sys_havegui())
        return;
    if (!INTER->i_guibuf)
    {
        if (!(INTER->i_guibuf = malloc(GUI_ALLOCCHUNK)))
        {
            fprintf(stderr, "Pd: couldn't allocate GUI buffer\n");
            sys_bail(1);
        }
        INTER->i_guisize = GUI_ALLOCCHUNK;
        INTER->i_guihead = INTER->i_guitail = 0;
    }
    if (INTER->i_guihead > INTER->i_guisize - (GUI_ALLOCCHUNK/2)) {
            sys_trytogetmoreguibuf(INTER->i_guisize + GUI_ALLOCCHUNK);
    }
    va_start(ap, fmt);
    msglen = vsnprintf(
        INTER->i_guibuf  + INTER->i_guihead,
        INTER->i_guisize - INTER->i_guihead,
        fmt, ap);
    va_end(ap);
    if(msglen < 0)
    {
        fprintf(stderr,
            "Pd: buffer space wasn't sufficient for long GUI string\n");
        return;
    }
    if (msglen >= INTER->i_guisize - INTER->i_guihead)
    {
        int msglen2, newsize =
            INTER->i_guisize
            + 1
            + (msglen > GUI_ALLOCCHUNK ? msglen : GUI_ALLOCCHUNK);
        sys_trytogetmoreguibuf(newsize);

        va_start(ap, fmt);
        msglen2 = vsnprintf(
            INTER->i_guibuf  + INTER->i_guihead,
            INTER->i_guisize - INTER->i_guihead,
            fmt, ap);
        va_end(ap);
        if (msglen2 != msglen)
            bug("sys_vgui");
        if (msglen >= INTER->i_guisize - INTER->i_guihead)
            msglen  = INTER->i_guisize - INTER->i_guihead;
    }
    if (sys_debuglevel & DEBUG_MESSUP)
    {
        const char *mess = INTER->i_guibuf + INTER->i_guihead;
        int colorize = stderr_isatty && (sys_debuglevel & DEBUG_COLORIZE);
        static int newmess = 1;
#ifdef _WIN32
    #ifdef _MSC_VER
        fwprintf(stderr, L"%S", mess);
    #else
        fwprintf(stderr, L"%s", mess);
    #endif
        fflush(stderr);
#else
        if (colorize)
            fprintf(stderr, "\e[0;1;35m%s%s\e[0m", (newmess)?">> ":"", mess);
        else
            fprintf(stderr, "%s%s", (newmess)?">> ":"", mess);

        newmess = ('\n' == mess[msglen-1]);
#endif
    }
    INTER->i_guihead += msglen;
    INTER->i_bytessincelastping += msglen;
}